

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(self + 10));
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)&self[8]._internal_metadata_);
    google::protobuf::
    RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>::
    ~RepeatedPtrField((RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
                       *)(self + 7));
    google::protobuf::
    RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::
    ~RepeatedPtrField((RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
                       *)&self[5]._internal_metadata_);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(self + 4));
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)&self[2]._internal_metadata_);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(self + 1));
    return;
  }
  SharedDtor((TestParsingMergeLite_RepeatedFieldsGenerator *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestParsingMergeLite_RepeatedFieldsGenerator::SharedDtor(MessageLite& self) {
  TestParsingMergeLite_RepeatedFieldsGenerator& this_ = static_cast<TestParsingMergeLite_RepeatedFieldsGenerator&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}